

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O3

void __thiscall pg::FPJSolver::runSeqGreedy(FPJSolver *this)

{
  ulong *puVar1;
  int *piVar2;
  char cVar3;
  void *pvVar4;
  void *__s;
  uint *__s_00;
  void *pvVar5;
  long lVar6;
  ostream *poVar7;
  long *plVar8;
  Game *pGVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  ulong uVar15;
  uint *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int from;
  int to;
  uint uVar20;
  uint local_78;
  int local_74;
  _label_vertex local_60;
  void *local_50;
  void *local_48;
  void *local_40;
  long local_38;
  
  pGVar9 = (this->super_Solver).game;
  uVar18 = pGVar9->n_vertices;
  local_50 = operator_new__(-(ulong)(uVar18 >> 0x3e != 0) | uVar18 * 4);
  uVar11 = uVar18 + 0x3f;
  uVar19 = uVar11 >> 3 & 0xfffffffffffffff8;
  pvVar4 = operator_new__(uVar19);
  if (0x3f < uVar11) {
    memset(pvVar4,0,uVar19);
  }
  __s = operator_new__(uVar19);
  if (0x3f < uVar11) {
    memset(__s,0,uVar19);
  }
  __s_00 = (uint *)operator_new__(uVar19);
  if ((0x3f < uVar11) && (memset(__s_00,0,uVar19), 0 < (long)uVar18)) {
    piVar2 = pGVar9->_priority;
    uVar11 = 0;
    do {
      uVar19 = uVar11 >> 6;
      uVar15 = 1L << (uVar11 & 0x3f);
      if ((*(byte *)(piVar2 + uVar11) & 1) == 0) {
        uVar15 = ~uVar15 & *(ulong *)(__s_00 + uVar19 * 2);
      }
      else {
        uVar15 = uVar15 | *(ulong *)(__s_00 + uVar19 * 2);
      }
      uVar11 = uVar11 + 1;
      *(ulong *)(__s_00 + uVar19 * 2) = uVar15;
    } while ((long)uVar11 < (long)uVar18);
  }
  pvVar5 = operator_new__(uVar18 * 4 & 0x3fffffffc);
  local_74 = 0;
  uVar13 = 0;
  bVar14 = false;
  local_78 = *__s_00 & 1;
  local_48 = pvVar5;
  local_40 = pvVar4;
  do {
    pGVar9 = (this->super_Solver).game;
    uVar18 = (ulong)(int)uVar13;
    uVar11 = pGVar9->n_vertices;
    if (uVar11 == uVar18) {
LAB_00161d9c:
      local_78 = uVar13;
      if (bVar14) {
        while (local_74 != 0) {
          pGVar9 = (this->super_Solver).game;
          lVar6 = (long)local_74;
          local_74 = local_74 + -1;
          local_38 = (long)*(int *)((long)pvVar5 + lVar6 * 4 + -4);
          piVar2 = pGVar9->_inedges;
          lVar6 = (long)pGVar9->_firstins[local_38];
          uVar13 = piVar2[lVar6];
          if (uVar13 != 0xffffffff) {
            puVar16 = (uint *)(piVar2 + lVar6 + 1);
            do {
              uVar18 = (ulong)(long)(int)uVar13 >> 6;
              uVar11 = *(ulong *)((long)pvVar4 + uVar18 * 8);
              if (((uVar11 >> ((ulong)uVar13 & 0x3f) & 1) != 0) &&
                 ((iVar10 = *(int *)((long)local_50 + (long)(int)uVar13 * 4), iVar10 == -1 ||
                  (iVar10 == (int)local_38)))) {
                if (1 < (this->super_Solver).trace) {
                  poVar7 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar7,"\x1b[31;1mresetting\x1b[m ",0x14);
                  local_60.g = (this->super_Solver).game;
                  local_60.v = uVar13;
                  poVar7 = operator<<(poVar7,&local_60);
                  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
                  std::ostream::put((char)poVar7);
                  std::ostream::flush();
                  uVar11 = *(ulong *)((long)pvVar4 + uVar18 * 8);
                  pvVar5 = local_48;
                }
                uVar19 = 1L << ((ulong)uVar13 & 0x3f);
                *(ulong *)((long)pvVar4 + uVar18 * 8) = ~uVar19 & uVar11;
                puVar1 = (ulong *)((long)__s + uVar18 * 8);
                *puVar1 = *puVar1 & ~uVar19;
                lVar6 = (long)local_74;
                local_74 = local_74 + 1;
                *(uint *)((long)pvVar5 + lVar6 * 4) = uVar13;
                if ((int)uVar13 < (int)local_78) {
                  local_78 = uVar13;
                }
              }
              uVar13 = *puVar16;
              puVar16 = puVar16 + 1;
            } while (uVar13 != 0xffffffff);
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar7 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"restarting after finding distractions of prio ",0x2e);
          plVar8 = (long *)std::ostream::operator<<
                                     (poVar7,((this->super_Solver).game)->_priority
                                             [(long)(int)local_78 + -1]);
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
        }
        uVar18 = (ulong)(int)local_78;
        local_74 = 0;
        this->iterations = this->iterations + 1;
        pGVar9 = (this->super_Solver).game;
        uVar11 = pGVar9->n_vertices;
        uVar13 = local_78;
      }
      if (uVar11 == uVar18) {
        pGVar9 = (this->super_Solver).game;
        lVar6 = pGVar9->n_vertices;
        if (0 < lVar6) {
          uVar11 = 0;
          do {
            uVar18 = uVar11 >> 6;
            if ((((this->super_Solver).disabled)->_bits[uVar18] >> (uVar11 & 0x3f) & 1) == 0) {
              uVar19 = 1L << (uVar11 & 0x3f);
              bVar14 = ((*(ulong *)((long)__s + uVar18 * 8) & uVar19) != 0) !=
                       ((*(ulong *)(__s_00 + uVar18 * 2) & uVar19) != 0);
              iVar10 = -1;
              if (bVar14 != (((pGVar9->_owner)._bits[uVar18] & uVar19) == 0)) {
                iVar10 = *(int *)((long)local_50 + uVar11 * 4);
              }
              Oink::solve((this->super_Solver).oink,(int)uVar11,(uint)bVar14,iVar10);
              pGVar9 = (this->super_Solver).game;
              lVar6 = pGVar9->n_vertices;
            }
            uVar11 = uVar11 + 1;
          } while ((long)uVar11 < lVar6);
        }
        operator_delete__(local_50);
        poVar7 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"solved with ",0xc);
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," iterations.",0xc);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        operator_delete__(pvVar5);
        operator_delete__(__s_00);
        operator_delete__(__s);
        operator_delete__(pvVar4);
        return;
      }
      uVar19 = uVar18 >> 6;
      bVar14 = false;
      uVar15 = 1L << (uVar18 & 0x3f);
      local_78 = (uint)((*(ulong *)(__s_00 + uVar19 * 2) >> (uVar18 & 0x3f) & 1) != 0);
LAB_00161ff7:
      uVar11 = *(ulong *)((long)pvVar4 + uVar19 * 8);
      if ((uVar15 & uVar11) == 0) {
        *(ulong *)((long)pvVar4 + uVar19 * 8) = uVar11 | uVar15;
        piVar2 = pGVar9->_outedges;
        lVar6 = (long)pGVar9->_firstouts[uVar18];
        uVar20 = piVar2[lVar6];
        uVar11 = (ulong)uVar20;
        if (((pGVar9->_owner)._bits[uVar19] & uVar15) == 0) {
          uVar12 = 1;
          if (uVar20 != 0xffffffff) {
            puVar16 = (uint *)(piVar2 + lVar6 + 1);
            do {
              uVar20 = (uint)uVar11;
              uVar17 = (ulong)(long)(int)uVar20 >> 6;
              if (((((this->super_Solver).disabled)->_bits[uVar17] >> (uVar11 & 0x3f) & 1) == 0) &&
                 (uVar11 = 1L << (uVar11 & 0x3f),
                 ((*(ulong *)(__s_00 + uVar17 * 2) & uVar11) != 0) ==
                 ((*(ulong *)((long)__s + uVar17 * 8) & uVar11) != 0))) {
                uVar12 = 0;
                goto LAB_0016210b;
              }
              uVar20 = *puVar16;
              uVar11 = (ulong)uVar20;
              puVar16 = puVar16 + 1;
            } while (uVar20 != 0xffffffff);
          }
        }
        else {
          uVar12 = 0;
          if (uVar20 != 0xffffffff) {
            puVar16 = (uint *)(piVar2 + lVar6 + 1);
            do {
              uVar20 = (uint)uVar11;
              uVar17 = (ulong)(long)(int)uVar20 >> 6;
              if (((((this->super_Solver).disabled)->_bits[uVar17] >> (uVar11 & 0x3f) & 1) == 0) &&
                 (uVar11 = 1L << (uVar11 & 0x3f),
                 ((*(ulong *)((long)__s + uVar17 * 8) & uVar11) != 0) !=
                 ((*(ulong *)(__s_00 + uVar17 * 2) & uVar11) != 0))) {
                uVar12 = 1;
                goto LAB_0016210b;
              }
              uVar20 = *puVar16;
              uVar11 = (ulong)uVar20;
              puVar16 = puVar16 + 1;
              uVar12 = 0;
            } while (uVar20 != 0xffffffff);
          }
        }
        uVar20 = 0xffffffff;
LAB_0016210b:
        *(uint *)((long)local_50 + uVar18 * 4) = uVar20;
        pvVar4 = local_40;
        if (local_78 == uVar12) {
          if (1 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[38;5;165;1mjustified\x1b[m ",0x1a);
            local_60.g = (this->super_Solver).game;
            local_60.v = uVar13;
            operator<<(poVar7,&local_60);
            if (uVar20 != 0xffffffff) {
              poVar7 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," => ",4);
              local_60.g = (this->super_Solver).game;
              local_60.v = uVar20;
              operator<<(poVar7,&local_60);
            }
            poVar7 = (this->super_Solver).logger;
            cVar3 = (char)poVar7;
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
          }
        }
        else {
          lVar6 = (long)local_74;
          local_74 = local_74 + 1;
          *(uint *)((long)pvVar5 + lVar6 * 4) = uVar13;
          puVar1 = (ulong *)((long)__s + uVar19 * 8);
          *puVar1 = *puVar1 | uVar15;
          bVar14 = true;
          if (1 < (this->super_Solver).trace) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\x1b[38;5;165;1mjustified*\x1b[m ",0x1b);
            local_60.g = (this->super_Solver).game;
            local_60.v = uVar13;
            operator<<(poVar7,&local_60);
            if (uVar20 != 0xffffffff) {
              poVar7 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," => ",4);
              local_60.g = (this->super_Solver).game;
              local_60.v = uVar20;
              operator<<(poVar7,&local_60);
            }
            poVar7 = (this->super_Solver).logger;
            cVar3 = (char)poVar7;
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar3);
            std::ostream::put(cVar3);
            std::ostream::flush();
            bVar14 = true;
          }
        }
      }
    }
    else {
      uVar19 = uVar18 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar19] >> (uVar18 & 0x3f) & 1) == 0) {
        uVar15 = 1L << (uVar18 & 0x3f);
        if (local_78 != ((*(ulong *)(__s_00 + uVar19 * 2) & uVar15) != 0)) goto LAB_00161d9c;
        goto LAB_00161ff7;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void
FPJSolver::runSeqGreedy()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) { i++; continue; }
        justified[i] = true;

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        } else {
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}